

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCGeometryCollider.cpp
# Opt level: O1

int chrono::collision::ChGeometryCollider::ComputeBoxBoxCollisions
              (ChBox *mgeo1,ChMatrix33<double> *R1,Vector *T1,ChBox *mgeo2,ChMatrix33<double> *R2,
              Vector *T2,ChNarrowPhaseCollider *mcollider,bool just_intersection)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  bool bVar10;
  uint uVar11;
  RhsEtorType *p;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ChVector<float> local_2c4;
  ChVector<double> local_2b8;
  ChBox *local_298;
  ChBox *local_290;
  DstEvaluatorType dstEvaluator;
  Vector local_268;
  Vector local_250;
  Vector local_238;
  ChMatrix33<double> relRot;
  double ArrDist [12];
  SrcEvaluatorType srcEvaluator;
  
  if (just_intersection) {
    ArrDist[1] = (double)&srcEvaluator;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_innerDim = 3;
    ArrDist[0] = (double)&dstEvaluator;
    ArrDist[2] = (double)&local_2b8;
    dstEvaluator.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d
    .data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
            (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)&relRot;
    ArrDist[3] = (double)&relRot;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.m_matrix = &R1->super_Matrix<double,_3,_3,_1,_3,_3>;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhs = &R2->super_Matrix<double,_3,_3,_1,_3,_3>;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhsImpl.
    super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
    .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
    data = (unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            )(unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
              )R1;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
    data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
           (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)R2;
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)ArrDist);
    dVar7 = T2->m_data[0] - T1->m_data[0];
    dVar8 = T2->m_data[1] - T1->m_data[1];
    dVar9 = T2->m_data[2] - T1->m_data[2];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (R1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar7;
    auVar18._8_8_ = 0;
    auVar18._0_8_ =
         dVar8 * (R1->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar1 = vfmadd231sd_fma(auVar18,auVar13,auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (R1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar9;
    auVar1 = vfmadd231sd_fma(auVar1,auVar16,auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (R1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
    auVar19._8_8_ = 0;
    auVar19._0_8_ =
         dVar8 * (R1->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar2 = vfmadd231sd_fma(auVar19,auVar13,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (R1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[7];
    auVar2 = vfmadd231sd_fma(auVar2,auVar16,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (R1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar7;
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         dVar8 * (R1->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar3 = vfmadd231sd_fma(auVar15,auVar14,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (R1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar9;
    auVar3 = vfmadd231sd_fma(auVar3,auVar17,auVar6);
    local_238.m_data[0] = auVar1._0_8_;
    local_238.m_data[1] = auVar2._0_8_;
    local_238.m_data[2] = auVar3._0_8_;
    local_250.m_data[0] = (mgeo1->Size).m_data[0];
    local_250.m_data[1] = (mgeo1->Size).m_data[1];
    local_250.m_data[2] = (mgeo1->Size).m_data[2];
    local_268.m_data[0] = (mgeo2->Size).m_data[0];
    local_268.m_data[1] = (mgeo2->Size).m_data[1];
    local_268.m_data[2] = (mgeo2->Size).m_data[2];
    bVar10 = CHOBB::OBB_Overlap(&relRot,&local_238,&local_250,&local_268);
    if (bVar10) {
      ChCollisionPair::ChCollisionPair
                ((ChCollisionPair *)&srcEvaluator,(ChGeometry *)mgeo1,(ChGeometry *)mgeo2);
      ChNarrowPhaseCollider::AddCollisionPair(mcollider,(ChCollisionPair *)&srcEvaluator);
      return 1;
    }
  }
  else {
    p = (RhsEtorType *)&srcEvaluator;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.m_matrix = (non_const_type)0x0;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhs = (type)0x0;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhsImpl.
    super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
    .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
    data = (unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            )(evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>)0x0;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
    data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
           (plainobjectbase_evaluator_data<double,_3>)0x0;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_innerDim = 0;
    dstEvaluator.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d
    .data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
            (plainobjectbase_evaluator_data<double,_3>)0x0;
    relRot.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0022;
    local_298 = mgeo1;
    local_290 = mgeo2;
    uVar11 = BoxBoxCollisionTest2::BoxBoxContacts
                       (T1,R1,&mgeo1->Size,T2,R2,&mgeo2->Size,(double *)&relRot,(Vector *)p,
                        (Vector *)&dstEvaluator,ArrDist);
    if (0 < (int)uVar11) {
      uVar12 = 0;
      do {
        dVar7 = ArrDist[uVar12];
        if (dVar7 < 0.0022) {
          local_2b8.m_data[0] =
               (double)(((product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                          *)&p->
                             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                        )->m_lhs).m_matrix -
               dVar7 * (double)dstEvaluator.
                               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                               .m_d.data;
          local_2b8.m_data[1] = (double)*(type *)(p + 1) - dVar7 * 0.0;
          local_2b8.m_data[2] =
               (double)(((LhsEtorType *)(p + 2))->
                       super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
                       ).m_argImpl.
                       super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                       .m_d.data - dVar7 * 0.0;
          local_2c4.m_data[0] =
               (float)(double)dstEvaluator.
                              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                              .m_d.data;
          local_2c4.m_data[1] = 0.0;
          local_2c4.m_data[2] = 0.0;
          unique0x100005f6 = SUB3228(ZEXT832(0),0);
          relRot.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array.
          _16_28_ = unique0x100005f6 << 0x20;
          relRot.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5].
          _4_4_ = 0;
          ChCollisionPair::Set
                    ((ChCollisionPair *)&relRot,(ChGeometry *)local_298,(ChGeometry *)local_290,
                     &local_2b8,(ChVector<double> *)p,&local_2c4,(float *)0x0);
          ChNarrowPhaseCollider::AddCollisionPair(mcollider,(ChCollisionPair *)&relRot);
        }
        uVar12 = uVar12 + 1;
        p = p + 3;
      } while (uVar11 != uVar12);
    }
  }
  return 0;
}

Assistant:

int ChGeometryCollider::ComputeBoxBoxCollisions(
    geometry::ChBox& mgeo1,            ///< box 1
    ChMatrix33<>* R1,                  ///< absolute rotation of 1st model (with box 1)
    Vector* T1,                        ///< absolute position of 1st model (with box 1)
    geometry::ChBox& mgeo2,            ///< box 2
    ChMatrix33<>* R2,                  ///< absolute rotation of 2nd model (with box 2)
    Vector* T2,                        ///< absolute position of 2nd model (with box 2)
    ChNarrowPhaseCollider& mcollider,  ///< reference to a collider to store contacts into
    bool just_intersection  ///< if true, just report if intersecting (no further calculus on normal, depht, etc.)
) {
    if (just_intersection) {
        ChMatrix33<> relRot = R1->transpose() * (*R2);
        Vector relPos = R1->transpose() * ((*T2) - (*T1));

        if (CHOBB::OBB_Overlap(relRot, relPos, mgeo1.Size, mgeo2.Size)) {
            ChCollisionPair temp = ChCollisionPair(&mgeo1, &mgeo2);
            mcollider.AddCollisionPair(&temp);
            return 1;
        }
    } else {
        double ArrDist[12];  // 8 should be enough
        Vector ArrP[12];     // 8 should be enough
        Vector mnormal;

        int ncontacts = BoxBoxCollisionTest2::BoxBoxContacts(*T1, *R1, mgeo1.Size, *T2, *R2,
                                                             mgeo2.Size, CH_COLL_ENVELOPE, ArrP, mnormal, ArrDist);

        for (int i = 0; i < ncontacts; i++) {
            if (ArrDist[i] < CH_COLL_ENVELOPE) {
                ChCollisionPair temp = ChCollisionPair(&mgeo1, &mgeo2,  // geometries
                                                       Vadd(ArrP[i], Vmul(mnormal, -ArrDist[i])), ArrP[i],
                                                       mnormal);  // normal
                mcollider.AddCollisionPair(&temp);
            }
        }
    }
    return 0;
}